

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void * declare_new(t_symbol *s,int argc,t_atom *argv)

{
  t_pd *pp_Var1;
  _glist *x;
  int iVar2;
  undefined4 in_register_00000034;
  
  iVar2 = argc;
  pp_Var1 = pd_new(declare_class);
  *(undefined4 *)(pp_Var1 + 7) = 1;
  x = canvas_getcurrent();
  pp_Var1[6] = (t_pd)x;
  if ((x->field_0xe8 & 8) == 0) {
    canvas_declare(x,(t_symbol *)CONCAT44(in_register_00000034,iVar2),argc,argv);
  }
  return pp_Var1;
}

Assistant:

static void *declare_new(t_symbol *s, int argc, t_atom *argv)
{
    t_declare *x = (t_declare *)pd_new(declare_class);
    x->x_useme = 1;
    x->x_canvas = canvas_getcurrent();
        /* LATER update environment and/or load libraries */
    if (!x->x_canvas->gl_loading)
    {
        /* the object is created by the user (not by loading a patch),
         * so update canvas's properties on the fly */
        canvas_declare(x->x_canvas, s, argc, argv);
    }
    return (x);
}